

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

optional_idx
duckdb::GetFunctionDescriptionIndex
          (vector<duckdb::FunctionDescription,_true> *function_descriptions,
          vector<duckdb::LogicalType,_true> *function_parameter_types)

{
  optional_idx oVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference rhs;
  pointer pFVar5;
  pointer pLVar6;
  const_reference rhs_00;
  idx_t iVar7;
  pointer pFVar8;
  pointer pLVar9;
  idx_t i;
  ulong __n;
  idx_t iVar10;
  ulong uVar11;
  idx_t local_68;
  optional_idx specificity_score;
  optional_idx best_specificity_score;
  LogicalType local_48;
  
  pFVar8 = (function_descriptions->
           super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>).
           super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar5 = (function_descriptions->
           super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>).
           super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pFVar5 - (long)pFVar8 == 0x80) {
    pLVar9 = (function_parameter_types->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar6 = (function_parameter_types->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68 = 0;
    for (uVar11 = 0;
        pvVar3 = vector<duckdb::FunctionDescription,_true>::get<true>(function_descriptions,0),
        uVar11 < (ulong)(((long)(pvVar3->parameter_types).
                                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                .
                                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar3->parameter_types).
                               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               .
                               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
        uVar11 = uVar11 + 1) {
      if (uVar11 < (ulong)(((long)pLVar9 - (long)pLVar6) / 0x18)) {
        pvVar3 = vector<duckdb::FunctionDescription,_true>::get<true>(function_descriptions,0);
        pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(&pvVar3->parameter_types,uVar11);
        LogicalType::LogicalType(&local_48,ANY);
        bVar2 = LogicalType::operator!=(pvVar4,&local_48);
        if (bVar2) {
          pvVar3 = vector<duckdb::FunctionDescription,_true>::get<true>(function_descriptions,0);
          pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(&pvVar3->parameter_types,uVar11);
          rhs = vector<duckdb::LogicalType,_true>::get<true>(function_parameter_types,uVar11);
          bVar2 = LogicalType::operator!=(pvVar4,rhs);
          LogicalType::~LogicalType(&local_48);
          if (bVar2) {
            return (optional_idx)0xffffffffffffffff;
          }
        }
        else {
          LogicalType::~LogicalType(&local_48);
        }
      }
    }
  }
  else {
    best_specificity_score.index = 0xffffffffffffffff;
    specificity_score.index = 0xffffffffffffffff;
    local_68 = 0xffffffffffffffff;
    for (uVar11 = 0; uVar11 < (ulong)((long)pFVar5 - (long)pFVar8 >> 7); uVar11 = uVar11 + 1) {
      pvVar3 = vector<duckdb::FunctionDescription,_true>::get<true>(function_descriptions,uVar11);
      pLVar9 = (pvVar3->parameter_types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      pLVar6 = (pvVar3->parameter_types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if ((long)pLVar6 - (long)pLVar9 ==
          (long)(function_parameter_types->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(function_parameter_types->
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start) {
        iVar10 = 0;
        for (__n = 0; __n < (ulong)(((long)pLVar6 - (long)pLVar9) / 0x18); __n = __n + 1) {
          pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(&pvVar3->parameter_types,__n);
          if (pvVar4->id_ == ANY) {
            iVar10 = iVar10 + 1;
          }
          else {
            pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(&pvVar3->parameter_types,__n);
            rhs_00 = vector<duckdb::LogicalType,_true>::get<true>(function_parameter_types,__n);
            bVar2 = LogicalType::operator!=(pvVar4,rhs_00);
            if (bVar2) goto LAB_0188d308;
          }
          pLVar9 = (pvVar3->parameter_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pLVar6 = (pvVar3->parameter_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        optional_idx::optional_idx((optional_idx *)&local_48,iVar10);
        oVar1.index._0_1_ = local_48.id_;
        oVar1.index._1_1_ = local_48.physical_type_;
        oVar1.index._2_6_ = local_48._2_6_;
        specificity_score.index._0_1_ = local_48.id_;
        specificity_score.index._1_1_ = local_48.physical_type_;
        specificity_score.index._2_6_ = local_48._2_6_;
        if (local_48._0_8_ != 0xffffffffffffffff) {
          if (best_specificity_score.index != 0xffffffffffffffff) {
            iVar10 = optional_idx::GetIndex(&specificity_score);
            iVar7 = optional_idx::GetIndex(&best_specificity_score);
            oVar1 = specificity_score;
            if (iVar7 <= iVar10) goto LAB_0188d313;
          }
          best_specificity_score.index = specificity_score.index;
          optional_idx::optional_idx((optional_idx *)&local_48,uVar11);
          local_68._0_1_ = local_48.id_;
          local_68._1_1_ = local_48.physical_type_;
          local_68._2_6_ = local_48._2_6_;
          oVar1 = specificity_score;
        }
      }
      else {
LAB_0188d308:
        specificity_score.index = 0xffffffffffffffff;
        oVar1.index = specificity_score.index;
      }
LAB_0188d313:
      specificity_score.index = oVar1.index;
      pFVar8 = (function_descriptions->
               super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
               ).
               super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar5 = (function_descriptions->
               super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
               ).
               super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  return (optional_idx)local_68;
}

Assistant:

static optional_idx GetFunctionDescriptionIndex(vector<FunctionDescription> &function_descriptions,
                                                vector<LogicalType> &function_parameter_types) {
	if (function_descriptions.size() == 1) {
		// one description, use it even if nr of parameters don't match
		idx_t nr_function_parameters = function_parameter_types.size();
		for (idx_t i = 0; i < function_descriptions[0].parameter_types.size(); i++) {
			if (i < nr_function_parameters && function_descriptions[0].parameter_types[i] != LogicalTypeId::ANY &&
			    function_descriptions[0].parameter_types[i] != function_parameter_types[i]) {
				return optional_idx::Invalid();
			}
		}
		return optional_idx(0);
	}

	// multiple descriptions, search most specific description
	optional_idx best_description_idx;
	// specificity_score: 0: exact type match; N: match using N <ANY> values; Invalid(): no match
	optional_idx best_specificity_score;
	optional_idx specificity_score;
	for (idx_t descr_idx = 0; descr_idx < function_descriptions.size(); descr_idx++) {
		specificity_score = CalcDescriptionSpecificity(function_descriptions[descr_idx], function_parameter_types);
		if (specificity_score.IsValid() &&
		    (!best_specificity_score.IsValid() || specificity_score.GetIndex() < best_specificity_score.GetIndex())) {
			best_specificity_score = specificity_score;
			best_description_idx = descr_idx;
		}
	}
	return best_description_idx;
}